

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.cpp
# Opt level: O0

bool __thiscall
slang::analysis::FlowAnalysisBase::isFullyCovered(FlowAnalysisBase *this,CaseStatement *stmt)

{
  Expression *pEVar1;
  __type_conflict4 _Var2;
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  SourceRange range_03;
  SourceRange range_04;
  SourceRange range_05;
  SourceRange range_06;
  SourceRange range_07;
  SourceRange range_08;
  DiagCode noteCode;
  DiagCode noteCode_00;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  SourceRange referencingRange;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  ConstantValue *pCVar3;
  bool bVar4;
  undefined1 uVar5;
  bool bVar6;
  bitwidth_t bVar7;
  reference ppEVar8;
  StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>
  *pSVar9;
  pointer ppVar10;
  Type *pTVar11;
  reference pbVar12;
  reference pbVar13;
  CaseDecisionDag *pCVar14;
  reference puVar15;
  reference ppVar16;
  reference ppEVar17;
  size_type sVar18;
  iterator pSVar19;
  long in_RSI;
  long in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar20;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar21;
  string_view sVar22;
  SVInt *val_2;
  iterator __end3_1;
  iterator __begin3_1;
  SmallVector<slang::SVInt,_2UL> *__range3_1;
  bool fullCaseFourState;
  Diagnostic *diag_4;
  type_conflict5 *second;
  type_conflict5 *first;
  iterator __end5_1;
  iterator __begin5_1;
  flat_hash_set<std::pair<ClauseIndex,_ClauseIndex>_> *__range5_1;
  Diagnostic *diag_3;
  uint index;
  iterator __end5;
  iterator __begin5;
  flat_hash_set<ClauseIndex> *__range5;
  Diagnostic *diag_2;
  Diagnostic *diag_1;
  DiagCode code;
  size_t remainder;
  string msg;
  ConstantValue *val_1;
  EnumValueSymbol *ev;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> __end4;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> __begin4;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  *__range4;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> missing;
  anon_class_40_5_99d61402 makeDecisionDag;
  optional<slang::analysis::CaseDecisionDag> decisionDag;
  IntegerLiteral *lit;
  Expression *unwrapped;
  SVInt *val;
  Diagnostic *diag;
  type_conflict1 *inserted;
  type *it;
  ConstantValue cv;
  Expression *item;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  ItemGroup *g;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *__range2;
  SmallVector<const_slang::ast::Expression_*,_5UL> itemExpressions;
  SmallVector<slang::SVInt,_2UL> intVals;
  SmallMap<slang::ConstantValue,_const_slang::ast::Expression_*,_4UL,_std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
  elems;
  bool hasNonConstItems;
  bool wildcard;
  CaseStatementCondition cond;
  bitwidth_t bitWidth;
  Type *caseType;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>,_slang::ConstantValue_&&,_void>
  x;
  locator loc;
  size_t pos0;
  size_t hash;
  ConstantValue *k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  size_t hash_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  IntegerLiteral *in_stack_fffffffffffff018;
  undefined7 in_stack_fffffffffffff020;
  undefined1 in_stack_fffffffffffff027;
  undefined4 in_stack_fffffffffffff028;
  undefined4 in_stack_fffffffffffff02c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff030;
  Diagnostic *in_stack_fffffffffffff038;
  undefined5 in_stack_fffffffffffff040;
  undefined1 in_stack_fffffffffffff045;
  undefined1 in_stack_fffffffffffff046;
  undefined1 in_stack_fffffffffffff047;
  SourceLocation in_stack_fffffffffffff048;
  undefined4 in_stack_fffffffffffff050;
  uint uVar23;
  undefined1 in_stack_fffffffffffff054;
  undefined1 in_stack_fffffffffffff055;
  undefined1 in_stack_fffffffffffff056;
  undefined1 in_stack_fffffffffffff057;
  SourceLocation in_stack_fffffffffffff058;
  undefined4 in_stack_fffffffffffff060;
  DiagCode in_stack_fffffffffffff064;
  Diagnostic *in_stack_fffffffffffff068;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff070;
  Diagnostic *in_stack_fffffffffffff078;
  Expression **in_stack_fffffffffffff090;
  ConstantValue *in_stack_fffffffffffff098;
  try_emplace_args_t *in_stack_fffffffffffff0a0;
  size_t in_stack_fffffffffffff0a8;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
  *in_stack_fffffffffffff0b0;
  EnumValueSymbol *in_stack_fffffffffffff148;
  SourceLocation in_stack_fffffffffffff150;
  undefined4 *puVar24;
  SourceLocation in_stack_fffffffffffff158;
  undefined6 in_stack_fffffffffffff288;
  byte in_stack_fffffffffffff28f;
  bitwidth_t in_stack_fffffffffffff290;
  undefined1 in_stack_fffffffffffff294;
  byte in_stack_fffffffffffff295;
  undefined1 in_stack_fffffffffffff296;
  undefined1 in_stack_fffffffffffff297;
  IntegerLiteral *in_stack_fffffffffffff298;
  bool local_ca1;
  iterator local_c90;
  bitmask<slang::analysis::AnalysisFlags> local_c80;
  byte local_c7a;
  byte local_c79;
  undefined4 local_c50;
  bitmask<slang::analysis::AnalysisFlags> local_c4c;
  SourceLocation local_c48;
  undefined8 uStack_c40;
  undefined4 local_c2c;
  string_view local_c28;
  SourceLocation local_c18;
  SourceLocation SStack_c10;
  undefined4 local_c04;
  Diagnostic *local_c00;
  type_conflict5 *local_bf8;
  uint *local_bf0;
  pair<unsigned_int,_unsigned_int> local_be8;
  iterator local_be0;
  iterator local_bd0;
  flat_hash_set<std::pair<ClauseIndex,_ClauseIndex>_> *local_bc0;
  string_view local_bb8;
  SourceLocation local_ba8;
  SourceLocation SStack_ba0;
  undefined4 local_b8c;
  Diagnostic *local_b88;
  uint local_b7c;
  iterator local_b78;
  iterator local_b68;
  CaseDecisionDag *local_b58;
  string_view local_b28;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined4 local_b04;
  Diagnostic *local_b00;
  string_view local_af8;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined4 local_ad4;
  Diagnostic *local_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined4 local_ab0;
  undefined4 local_aac;
  char *local_aa8;
  char *local_aa0;
  undefined8 local_a98;
  undefined1 local_a90 [32];
  long local_a70;
  char *local_a68;
  undefined8 local_a60;
  undefined1 local_a58 [32];
  char *local_a38;
  undefined8 local_a30;
  undefined1 local_a28 [32];
  char *local_a08;
  undefined8 local_a00;
  undefined1 local_9f8 [80];
  ConstantValue *local_9a8;
  EnumValueSymbol *local_9a0;
  Symbol *local_998;
  Symbol *local_990;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  local_988;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  *local_978;
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> local_970;
  undefined1 *local_938;
  SmallVectorBase<slang::SVInt> *local_930;
  bitwidth_t *local_928;
  int *local_920;
  undefined1 local_910 [232];
  SourceLocation local_828;
  SourceLocation SStack_820;
  undefined4 local_810;
  byte local_809;
  SourceLocation local_7f8;
  SourceLocation SStack_7f0;
  undefined4 local_7e8;
  byte local_7e1;
  SVInt local_7e0;
  IntegerLiteral *local_7d0;
  Expression *local_7c8;
  SVInt local_7c0;
  SVInt *local_7b0;
  SourceLocation local_7a8;
  SourceLocation SStack_7a0;
  undefined4 local_78c;
  string_view local_788;
  SourceLocation local_778;
  SourceLocation SStack_770;
  undefined4 local_75c;
  Diagnostic *local_758;
  type_conflict1 *local_750;
  type *local_748;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_740;
  ConstantValue local_718;
  Expression *local_6f0;
  not_null<const_slang::ast::Type_*> local_6e8;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_6e0;
  SourceLocation local_6d8;
  SourceLocation local_6d0;
  SourceLocation local_6c8;
  __normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
  local_6c0;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_6b8;
  SmallVectorBase<const_slang::ast::Expression_*> local_6b0 [2];
  SmallVectorBase<slang::SVInt> local_670 [6];
  undefined1 local_570 [16];
  size_t local_560;
  ulong local_548;
  ulong local_540;
  byte local_52a;
  bool local_529;
  int local_528;
  bitwidth_t local_524;
  Type *local_520;
  long local_518;
  bool local_501;
  IntegerLiteral *local_500;
  ConstantValue *local_4f8;
  undefined1 *local_4f0;
  const_iterator local_4e8;
  char_pointer local_4d8;
  table_element_pointer local_4d0;
  ConstantValue *local_4c8;
  undefined1 *local_4c0;
  undefined1 local_4b8 [16];
  undefined8 local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  undefined8 uStack_490;
  reference local_488;
  char *local_480;
  undefined8 uStack_478;
  undefined1 *local_470;
  undefined1 local_468 [32];
  undefined8 local_448;
  undefined1 *local_440;
  char *local_438;
  undefined8 uStack_430;
  reference local_420;
  reference local_418;
  char *local_410;
  undefined8 uStack_408;
  undefined1 *local_400;
  undefined1 local_3f8 [48];
  undefined8 local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  undefined8 uStack_3b0;
  reference local_3a8;
  reference local_3a0;
  reference local_398;
  char *local_390;
  undefined8 uStack_388;
  undefined1 *local_380;
  undefined1 local_378 [48];
  long local_348 [2];
  char *local_338 [2];
  undefined8 local_328;
  undefined1 *local_320;
  char *local_318;
  undefined8 uStack_310;
  char **local_300;
  long *local_2f8;
  reference local_2f0;
  reference local_2e8;
  reference local_2e0;
  char *local_2d8;
  undefined8 uStack_2d0;
  undefined1 *local_2c8;
  undefined1 local_2b9;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>,_slang::ConstantValue_&&,_void>
  local_2b8;
  IntegerLiteral *local_2b0;
  ConstantValue *local_2a8;
  undefined1 *local_2a0;
  bool local_291 [25];
  iterator local_278;
  bool local_261 [25];
  iterator local_248;
  bool local_231;
  iterator local_230;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>_>
  local_220;
  size_t local_208;
  size_t local_200;
  ConstantValue *local_1f8;
  IntegerLiteral *local_1f0;
  ConstantValue *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  uint local_1cc;
  value_type *local_1c8;
  value_type *local_1c0;
  uint local_1b4;
  group_type *local_1b0;
  size_t local_1a8;
  pow2_quadratic_prober local_1a0;
  size_t local_190;
  size_t local_188;
  ConstantValue *local_180;
  undefined1 *local_178;
  ConstantValue *local_170;
  undefined1 *local_168;
  char_pointer local_160;
  table_element_pointer local_158;
  table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_150;
  ConstantValue *local_140;
  undefined1 *local_138;
  table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_130;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>_>
  local_120;
  ConstantValue *local_108;
  undefined1 *local_100;
  iterator local_f8;
  size_t local_e8;
  ConstantValue *local_e0;
  undefined1 *local_d8;
  uint local_cc;
  value_type *local_c8;
  value_type *local_c0;
  uint local_b4;
  group_type *local_b0;
  size_t local_a8;
  pow2_quadratic_prober local_a0;
  size_t local_90;
  size_t local_88;
  ConstantValue *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined8 *local_68;
  undefined1 *local_60;
  undefined8 *local_58;
  undefined1 *local_50;
  undefined8 *local_48;
  long local_40;
  long *local_38;
  char *local_30;
  char **local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  long local_10;
  long *local_8;
  
  local_518 = in_RSI;
  local_520 = not_null<const_slang::ast::Type_*>::operator*
                        ((not_null<const_slang::ast::Type_*> *)0xa8c59c);
  ast::Expression::unwrapImplicitConversions
            ((Expression *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
  not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xa8c5c1);
  local_524 = ast::Type::getBitWidth
                        ((Type *)CONCAT44(in_stack_fffffffffffff02c,in_stack_fffffffffffff028));
  local_528 = *(int *)(local_518 + 0x40);
  local_ca1 = local_528 == 1 || local_528 == 2;
  local_529 = local_ca1;
  local_52a = 0;
  SmallMap<slang::ConstantValue,_const_slang::ast::Expression_*,_4UL,_std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
  ::SmallMap((SmallMap<slang::ConstantValue,_const_slang::ast::Expression_*,_4UL,_std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
              *)in_stack_fffffffffffff030);
  SmallVector<slang::SVInt,_2UL>::SmallVector((SmallVector<slang::SVInt,_2UL> *)0xa8c639);
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0xa8c646);
  local_6b8.pVal = (uint64_t *)(local_518 + 0x28);
  local_6c0._M_current =
       (ItemGroup *)
       std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *)
                  in_stack_fffffffffffff018);
  local_6c8 = (SourceLocation)
              std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>::end
                        ((span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *
                         )CONCAT44(in_stack_fffffffffffff02c,in_stack_fffffffffffff028));
  while( true ) {
    bVar4 = __gnu_cxx::
            operator==<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
                        *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
                       (__normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffff018);
    if (((bVar4 ^ 0xffU) & 1) == 0) break;
    local_6d8 = (SourceLocation)
                __gnu_cxx::
                __normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
                ::operator*(&local_6c0);
    local_6d0 = local_6d8;
    local_6e0._M_current =
         (Expression **)
         std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                   ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                    in_stack_fffffffffffff018);
    local_6e8.ptr =
         (Type *)std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                           ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                            CONCAT44(in_stack_fffffffffffff02c,in_stack_fffffffffffff028));
    while( true ) {
      bVar4 = __gnu_cxx::
              operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                          *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
                         (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                          *)in_stack_fffffffffffff018);
      if (((bVar4 ^ 0xffU) & 1) == 0) break;
      ppEVar8 = __gnu_cxx::
                __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                ::operator*(&local_6e0);
      local_6f0 = *ppEVar8;
      ast::Expression::eval
                ((Expression *)CONCAT44(in_stack_fffffffffffff02c,in_stack_fffffffffffff028),
                 (EvalContext *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
      bVar4 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa8c75b);
      if (bVar4) {
        local_4f8 = &local_718;
        local_500 = (IntegerLiteral *)&local_6f0;
        local_4f0 = local_570;
        local_2b0 = local_500;
        local_2a8 = local_4f8;
        local_2a0 = local_570;
        pSVar9 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                 ::al((table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                       *)0xa8c7e9);
        boost::unordered::detail::foa::
        alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>,_slang::ConstantValue_&&,_void>
        ::alloc_cted_or_fwded_key_type(&local_2b8,pSVar9,local_2a8);
        local_1e8 = boost::unordered::detail::foa::
                    alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>,_slang::ConstantValue_&&,_void>
                    ::move_or_fwd(&local_2b8);
        local_1e0 = &local_2b9;
        local_1f0 = local_2b0;
        local_1d8 = local_570;
        local_1f8 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,slang::detail::hashing::StackAllocator<std::pair<slang::ConstantValue_const,slang::ast::Expression_const*>,192ul,16ul>>
                    ::key_from<slang::ConstantValue,slang::ast::Expression_const*>
                              (local_1e8,local_2b0);
        local_200 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                    ::hash_for<slang::ConstantValue>
                              ((table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                                *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
                               (ConstantValue *)in_stack_fffffffffffff018);
        local_208 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                    ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                                    *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
                                   (size_t)in_stack_fffffffffffff018);
        local_180 = local_1f8;
        local_190 = local_200;
        local_188 = local_208;
        local_178 = local_570;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_1a0,local_208);
        do {
          local_1a8 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_1a0);
          local_1b0 = boost::unordered::detail::foa::
                      table_arrays<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                      ::groups((table_arrays<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                                *)0xa8c967);
          local_1b0 = local_1b0 + local_1a8;
          local_1b4 = boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::match
                                ((group15<boost::unordered::detail::foa::plain_integral> *)
                                 CONCAT44(in_stack_fffffffffffff02c,in_stack_fffffffffffff028),
                                 CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
          if (local_1b4 != 0) {
            local_1c0 = boost::unordered::detail::foa::
                        table_arrays<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                        ::elements((table_arrays<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                                    *)0xa8c9c9);
            local_1c8 = local_1c0 + local_1a8 * 0xf;
            do {
              local_1cc = boost::unordered::detail::foa::unchecked_countr_zero(0);
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
              ::pred((table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                      *)0xa8ca1c);
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,slang::detail::hashing::StackAllocator<std::pair<slang::ConstantValue_const,slang::ast::Expression_const*>,192ul,16ul>>
              ::key_from<std::pair<slang::ConstantValue_const,slang::ast::Expression_const*>>
                        ((pair<const_slang::ConstantValue,_const_slang::ast::Expression_*> *)
                         0xa8ca53);
              bVar4 = std::equal_to<slang::ConstantValue>::operator()
                                ((equal_to<slang::ConstantValue> *)
                                 CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
                                 (ConstantValue *)in_stack_fffffffffffff018,
                                 (ConstantValue *)0xa8ca7a);
              if (bVar4) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>_>
                ::table_locator(&local_220,local_1b0,local_1cc,local_1c8 + local_1cc);
                goto LAB_00a8cb7f;
              }
              local_1b4 = local_1b4 - 1 & local_1b4;
            } while (local_1b4 != 0);
          }
          bVar4 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
                             (size_t)in_stack_fffffffffffff018);
          if (bVar4) {
            memset(&local_220,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>_>
            ::table_locator(&local_220);
            goto LAB_00a8cb7f;
          }
          bVar4 = boost::unordered::detail::foa::pow2_quadratic_prober::next(&local_1a0,local_560);
        } while (bVar4);
        memset(&local_220,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>_>
        ::table_locator(&local_220);
LAB_00a8cb7f:
        bVar4 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                          ((table_locator *)&local_220);
        if (bVar4) {
          local_230 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                      ::make_iterator((locator *)0xa8cba1);
          local_231 = false;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    (&local_740,&local_230,&local_231);
        }
        else if (local_540 < local_548) {
          in_stack_fffffffffffff018 = local_1f0;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,slang::detail::hashing::StackAllocator<std::pair<slang::ConstantValue_const,slang::ast::Expression_const*>,192ul,16ul>>
          ::
          unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ConstantValue,slang::ast::Expression_const*&>
                    ((table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                      *)CONCAT17(in_stack_fffffffffffff057,
                                 CONCAT16(in_stack_fffffffffffff056,
                                          CONCAT15(in_stack_fffffffffffff055,
                                                   CONCAT14(in_stack_fffffffffffff054,
                                                            in_stack_fffffffffffff050)))),
                     (size_t)in_stack_fffffffffffff048,
                     CONCAT17(in_stack_fffffffffffff047,
                              CONCAT16(in_stack_fffffffffffff046,
                                       CONCAT15(in_stack_fffffffffffff045,in_stack_fffffffffffff040)
                                      )),(try_emplace_args_t *)in_stack_fffffffffffff038,
                     (ConstantValue *)in_stack_fffffffffffff030,
                     (Expression **)CONCAT44(in_stack_fffffffffffff064,in_stack_fffffffffffff060));
          local_248 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                      ::make_iterator((locator *)0xa8cc43);
          local_261[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    (&local_740,&local_248,local_261);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,slang::detail::hashing::StackAllocator<std::pair<slang::ConstantValue_const,slang::ast::Expression_const*>,192ul,16ul>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ConstantValue,slang::ast::Expression_const*&>
                    (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
                     in_stack_fffffffffffff098,in_stack_fffffffffffff090);
          local_278 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                      ::make_iterator((locator *)0xa8ccbe);
          local_291[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    (&local_740,&local_278,local_291);
        }
        local_748 = std::
                    get<0ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                              ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                                *)0xa8cd06);
        local_750 = std::
                    get<1ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                              ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                                *)0xa8cd1b);
        if ((*local_750 & 1U) == 0) {
          if (*(long *)(in_RDI + 0x18) != 0) {
            local_75c = 0xd000e;
            local_778 = (local_6f0->sourceRange).startLoc;
            SStack_770 = (local_6f0->sourceRange).endLoc;
            range_01.startLoc._4_1_ = in_stack_fffffffffffff054;
            range_01.startLoc._0_4_ = in_stack_fffffffffffff050;
            range_01.startLoc._5_1_ = in_stack_fffffffffffff055;
            range_01.startLoc._6_1_ = in_stack_fffffffffffff056;
            range_01.startLoc._7_1_ = in_stack_fffffffffffff057;
            range_01.endLoc = in_stack_fffffffffffff058;
            local_758 = Diagnostics::add((Diagnostics *)in_stack_fffffffffffff048,
                                         (Symbol *)
                                         CONCAT17(in_stack_fffffffffffff047,
                                                  CONCAT16(in_stack_fffffffffffff046,
                                                           CONCAT15(in_stack_fffffffffffff045,
                                                                    in_stack_fffffffffffff040))),
                                         in_stack_fffffffffffff064,range_01);
            sVar22 = ast::SemanticFacts::getCaseConditionStr(Normal);
            arg._M_str = (char *)in_stack_fffffffffffff070;
            arg._M_len = (size_t)in_stack_fffffffffffff068;
            local_788 = sVar22;
            Diagnostic::operator<<
                      ((Diagnostic *)CONCAT44(in_stack_fffffffffffff064,in_stack_fffffffffffff060),
                       arg);
            boost::unordered::detail::foa::
            table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
            ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
            Diagnostic::operator<<
                      ((Diagnostic *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
                       (ConstantValue *)in_stack_fffffffffffff018);
            local_78c = 0xc0001;
            ppVar10 = boost::unordered::detail::foa::
                      table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                      ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                    *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020))
            ;
            local_7a8 = (ppVar10->second->sourceRange).startLoc;
            SStack_7a0 = (ppVar10->second->sourceRange).endLoc;
            noteCode.subsystem._1_1_ = in_stack_fffffffffffff055;
            noteCode.subsystem._0_1_ = in_stack_fffffffffffff054;
            noteCode.code._0_1_ = in_stack_fffffffffffff056;
            noteCode.code._1_1_ = in_stack_fffffffffffff057;
            range.startLoc._5_1_ = in_stack_fffffffffffff045;
            range.startLoc._0_5_ = in_stack_fffffffffffff040;
            range.startLoc._6_1_ = in_stack_fffffffffffff046;
            range.startLoc._7_1_ = in_stack_fffffffffffff047;
            range.endLoc = in_stack_fffffffffffff048;
            Diagnostic::addNote(in_stack_fffffffffffff038,noteCode,range);
          }
        }
        else {
          boost::unordered::detail::foa::
          table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
          ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                        *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
          bVar4 = slang::ConstantValue::isInteger((ConstantValue *)0xa8ceeb);
          if (bVar4) {
            boost::unordered::detail::foa::
            table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
            ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
            local_7b0 = slang::ConstantValue::integer((ConstantValue *)0xa8cf19);
            uVar20 = extraout_XMM0_Da;
            uVar21 = extraout_XMM0_Db;
            if (local_528 == 2) {
              bVar7 = SVInt::countXs((SVInt *)CONCAT44(in_stack_fffffffffffff02c,
                                                       in_stack_fffffffffffff028));
              uVar20 = extraout_XMM0_Da_00;
              uVar21 = extraout_XMM0_Db_00;
              if (bVar7 != 0) goto LAB_00a8cff2;
            }
            SVInt::trunc(&local_7c0,(double)CONCAT44(uVar21,uVar20));
            SmallVectorBase<slang::SVInt>::push_back
                      ((SmallVectorBase<slang::SVInt> *)
                       CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
                       (SVInt *)in_stack_fffffffffffff018);
            SVInt::~SVInt((SVInt *)in_stack_fffffffffffff030);
            SmallVectorBase<const_slang::ast::Expression_*>::push_back
                      ((SmallVectorBase<const_slang::ast::Expression_*> *)
                       CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
                       (Expression **)in_stack_fffffffffffff018);
          }
        }
      }
      else {
        local_52a = 1;
      }
LAB_00a8cff2:
      slang::ConstantValue::~ConstantValue((ConstantValue *)0xa8cfff);
      if ((*(long *)(in_RDI + 0x18) != 0) && ((local_528 == 0 || (local_528 == 2)))) {
        local_7c8 = ast::Expression::unwrapImplicitConversions
                              ((Expression *)
                               CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
        if (local_7c8->kind == IntegerLiteral) {
          in_stack_fffffffffffff298 = ast::Expression::as<slang::ast::IntegerLiteral>(local_7c8);
          local_7e1 = 0;
          in_stack_fffffffffffff295 = false;
          local_7d0 = in_stack_fffffffffffff298;
          if (local_528 == 0) {
            ast::IntegerLiteral::getValue(in_stack_fffffffffffff018);
            local_7e1 = 1;
            in_stack_fffffffffffff296 = SVInt::hasUnknown(&local_7e0);
            in_stack_fffffffffffff295 = in_stack_fffffffffffff296;
          }
          in_stack_fffffffffffff297 = in_stack_fffffffffffff295;
          if ((local_7e1 & 1) != 0) {
            SVInt::~SVInt((SVInt *)in_stack_fffffffffffff030);
          }
          if ((in_stack_fffffffffffff295 & 1) == 0) {
            local_809 = 0;
            in_stack_fffffffffffff28f = false;
            if (local_528 == 2) {
              ast::IntegerLiteral::getValue(in_stack_fffffffffffff018);
              local_809 = 1;
              in_stack_fffffffffffff290 =
                   SVInt::countXs((SVInt *)CONCAT44(in_stack_fffffffffffff02c,
                                                    in_stack_fffffffffffff028));
              in_stack_fffffffffffff28f = in_stack_fffffffffffff290 != 0;
            }
            in_stack_fffffffffffff294 = in_stack_fffffffffffff28f;
            if ((local_809 & 1) != 0) {
              SVInt::~SVInt((SVInt *)in_stack_fffffffffffff030);
            }
            if ((in_stack_fffffffffffff28f & 1) != 0) {
              local_810 = 0x14000e;
              local_828 = (local_6f0->sourceRange).startLoc;
              SStack_820 = (local_6f0->sourceRange).endLoc;
              range_03.startLoc._4_1_ = in_stack_fffffffffffff054;
              range_03.startLoc._0_4_ = in_stack_fffffffffffff050;
              range_03.startLoc._5_1_ = in_stack_fffffffffffff055;
              range_03.startLoc._6_1_ = in_stack_fffffffffffff056;
              range_03.startLoc._7_1_ = in_stack_fffffffffffff057;
              range_03.endLoc = in_stack_fffffffffffff058;
              Diagnostics::add((Diagnostics *)in_stack_fffffffffffff048,
                               (Symbol *)
                               CONCAT17(in_stack_fffffffffffff047,
                                        CONCAT16(in_stack_fffffffffffff046,
                                                 CONCAT15(in_stack_fffffffffffff045,
                                                          in_stack_fffffffffffff040))),
                               in_stack_fffffffffffff064,range_03);
            }
          }
          else {
            local_7e8 = 0x11000e;
            local_7f8 = (local_6f0->sourceRange).startLoc;
            SStack_7f0 = (local_6f0->sourceRange).endLoc;
            range_02.startLoc._4_1_ = in_stack_fffffffffffff054;
            range_02.startLoc._0_4_ = in_stack_fffffffffffff050;
            range_02.startLoc._5_1_ = in_stack_fffffffffffff055;
            range_02.startLoc._6_1_ = in_stack_fffffffffffff056;
            range_02.startLoc._7_1_ = in_stack_fffffffffffff057;
            range_02.endLoc = in_stack_fffffffffffff058;
            Diagnostics::add((Diagnostics *)in_stack_fffffffffffff048,
                             (Symbol *)
                             CONCAT17(in_stack_fffffffffffff047,
                                      CONCAT16(in_stack_fffffffffffff046,
                                               CONCAT15(in_stack_fffffffffffff045,
                                                        in_stack_fffffffffffff040))),
                             in_stack_fffffffffffff064,range_02);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator++(&local_6e0);
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
    ::operator++(&local_6c0);
  }
  std::optional<slang::analysis::CaseDecisionDag>::optional
            ((optional<slang::analysis::CaseDecisionDag> *)0xa8d30f);
  local_938 = local_910;
  local_930 = local_670;
  local_928 = &local_524;
  local_920 = &local_528;
  if (*(long *)(in_RDI + 0x18) != 0) {
    uVar5 = ast::Type::isEnum((Type *)0xa8d377);
    if ((bool)uVar5) {
      SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL>::SmallVector
                ((SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *)0xa8d39d
                );
      pTVar11 = ast::Type::getCanonicalType
                          ((Type *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
      ast::Symbol::as<slang::ast::EnumType>((Symbol *)0xa8d3c1);
      local_988 = ast::EnumType::values((EnumType *)0xa8d3d8);
      local_978 = &local_988;
      local_990 = (Symbol *)
                  std::ranges::
                  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
                  ::begin(local_978);
      local_998 = (Symbol *)
                  std::ranges::
                  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
                  ::end(local_978);
      while( true ) {
        bVar4 = operator==<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>_>
                          ((self_type *)
                           CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
                           (specific_symbol_iterator<slang::ast::EnumValueSymbol> *)
                           in_stack_fffffffffffff018);
        if (((bVar4 ^ 0xffU) & 1) == 0) break;
        local_9a0 = iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
                    ::operator*((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
                                 *)0xa8d4a5);
        SourceRange::SourceRange
                  ((SourceRange *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
        referencingRange.endLoc = in_stack_fffffffffffff158;
        referencingRange.startLoc = in_stack_fffffffffffff150;
        local_9a8 = ast::EnumValueSymbol::getValue(in_stack_fffffffffffff148,referencingRange);
        local_4c8 = local_9a8;
        local_4c0 = local_570;
        local_170 = local_9a8;
        local_168 = local_570;
        local_140 = local_9a8;
        local_138 = local_570;
        local_108 = local_9a8;
        local_100 = local_570;
        local_e0 = local_9a8;
        local_d8 = local_570;
        local_e8 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                   ::hash_for<slang::ConstantValue>
                             ((table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                               *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
                              (ConstantValue *)in_stack_fffffffffffff018);
        pCVar3 = local_e0;
        local_88 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                   ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                                   *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
                                  (size_t)in_stack_fffffffffffff018);
        local_80 = pCVar3;
        local_90 = local_e8;
        local_78 = local_570;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_a0,local_88);
        do {
          local_a8 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_a0);
          local_b0 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                     ::groups((table_arrays<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                               *)0xa8d6ae);
          local_b0 = local_b0 + local_a8;
          local_b4 = boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::match
                               ((group15<boost::unordered::detail::foa::plain_integral> *)
                                CONCAT44(in_stack_fffffffffffff02c,in_stack_fffffffffffff028),
                                CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
          if (local_b4 != 0) {
            local_c0 = boost::unordered::detail::foa::
                       table_arrays<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                       ::elements((table_arrays<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                                   *)0xa8d710);
            local_c8 = local_c0 + local_a8 * 0xf;
            do {
              local_cc = boost::unordered::detail::foa::unchecked_countr_zero(0);
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
              ::pred((table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                      *)0xa8d763);
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,slang::detail::hashing::StackAllocator<std::pair<slang::ConstantValue_const,slang::ast::Expression_const*>,192ul,16ul>>
              ::key_from<std::pair<slang::ConstantValue_const,slang::ast::Expression_const*>>
                        ((pair<const_slang::ConstantValue,_const_slang::ast::Expression_*> *)
                         0xa8d79a);
              bVar4 = std::equal_to<slang::ConstantValue>::operator()
                                ((equal_to<slang::ConstantValue> *)
                                 CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
                                 (ConstantValue *)in_stack_fffffffffffff018,
                                 (ConstantValue *)0xa8d7c1);
              if (bVar4) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>_>
                ::table_locator(&local_120,local_b0,local_cc,local_c8 + local_cc);
                goto LAB_00a8d8c6;
              }
              local_b4 = local_b4 - 1 & local_b4;
            } while (local_b4 != 0);
          }
          bVar4 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
                             (size_t)in_stack_fffffffffffff018);
          if (bVar4) {
            memset(&local_120,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>_>
            ::table_locator(&local_120);
            goto LAB_00a8d8c6;
          }
          bVar4 = boost::unordered::detail::foa::pow2_quadratic_prober::next(&local_a0,local_560);
        } while (bVar4);
        memset(&local_120,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>_>
        ::table_locator(&local_120);
LAB_00a8d8c6:
        local_f8 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                   ::make_iterator((locator *)0xa8d8d5);
        local_150.pc_ = local_f8.pc_;
        local_150.p_ = local_f8.p_;
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
        ::table_iterator<false,_nullptr>(&local_130,&local_150);
        local_160 = local_130.pc_;
        local_158 = local_130.p_;
        local_4d8 = local_130.pc_;
        local_4d0 = local_130.p_;
        local_4e8 = boost::unordered::
                    unordered_flat_map<slang::ConstantValue,_const_slang::ast::Expression_*,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                    ::end((unordered_flat_map<slang::ConstantValue,_const_slang::ast::Expression_*,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                           *)0xa8d9c7);
        bVar4 = boost::unordered::detail::foa::operator!=
                          ((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                            *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
                           (table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                            *)in_stack_fffffffffffff018);
        if (!bVar4) {
          SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::push_back
                    ((SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                     CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
                     (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff018);
        }
        iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
        ::operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>_>
                  ((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
                    *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
      }
      bVar4 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::empty
                        (&local_970);
      if (!bVar4) {
        std::__cxx11::string::string(in_stack_fffffffffffff030);
        sVar18 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::size
                           (&local_970);
        if (sVar18 == 1) {
          local_a08 = "value \'{}\'";
          local_a00 = 10;
          local_488 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::
                      operator[](&local_970,0);
          local_470 = local_9f8;
          local_480 = local_a08;
          uStack_478 = local_a00;
          local_498 = local_a08;
          uStack_490 = local_a00;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff030,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffff02c,in_stack_fffffffffffff028));
          local_68 = &local_4a8;
          local_70 = local_4b8;
          local_4a8 = 0xd;
          fmt.data_._4_1_ = in_stack_fffffffffffff294;
          fmt.data_._0_4_ = in_stack_fffffffffffff290;
          fmt.data_._5_1_ = in_stack_fffffffffffff295;
          fmt.data_._6_1_ = in_stack_fffffffffffff296;
          fmt.data_._7_1_ = in_stack_fffffffffffff297;
          fmt.size_ = (size_t)in_stack_fffffffffffff298;
          args.field_1._0_6_ = in_stack_fffffffffffff288;
          args.desc_ = (unsigned_long_long)pTVar11;
          args.field_1._6_1_ = uVar5;
          args.field_1._7_1_ = in_stack_fffffffffffff28f;
          local_4a0 = local_70;
          ::fmt::v11::vformat_abi_cxx11_(fmt,args);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_fffffffffffff070,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff068);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
        }
        else {
          sVar18 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::size
                             (&local_970);
          if (sVar18 == 2) {
            local_a38 = "values \'{}\' and \'{}\'";
            local_a30 = 0x14;
            pbVar12 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::
                      operator[](&local_970,0);
            local_420 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::
                        operator[](&local_970,1);
            local_400 = local_a28;
            local_410 = local_a38;
            uStack_408 = local_a30;
            local_438 = local_a38;
            uStack_430 = local_a30;
            local_418 = pbVar12;
            ::fmt::v11::detail::value<fmt::v11::context>::
            value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                      ((value<fmt::v11::context> *)in_stack_fffffffffffff030,
                       (basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffff02c,in_stack_fffffffffffff028));
            ::fmt::v11::detail::value<fmt::v11::context>::
            value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                      ((value<fmt::v11::context> *)in_stack_fffffffffffff030,
                       (basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffff02c,in_stack_fffffffffffff028));
            local_58 = &local_448;
            local_60 = local_468;
            local_448 = 0xdd;
            fmt_00.data_._4_1_ = in_stack_fffffffffffff294;
            fmt_00.data_._0_4_ = in_stack_fffffffffffff290;
            fmt_00.data_._5_1_ = in_stack_fffffffffffff295;
            fmt_00.data_._6_1_ = in_stack_fffffffffffff296;
            fmt_00.data_._7_1_ = in_stack_fffffffffffff297;
            fmt_00.size_ = (size_t)in_stack_fffffffffffff298;
            args_00.field_1._0_6_ = in_stack_fffffffffffff288;
            args_00.desc_ = (unsigned_long_long)pTVar11;
            args_00.field_1._6_1_ = uVar5;
            args_00.field_1._7_1_ = in_stack_fffffffffffff28f;
            local_440 = local_60;
            ::fmt::v11::vformat_abi_cxx11_(fmt_00,args_00);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(in_stack_fffffffffffff070,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffff068);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
          }
          else {
            sVar18 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::size
                               (&local_970);
            if (sVar18 == 3) {
              local_a68 = "values \'{}\', \'{}\', and \'{}\'";
              local_a60 = 0x1b;
              pbVar12 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::
                        operator[](&local_970,0);
              pbVar13 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::
                        operator[](&local_970,1);
              local_3a8 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::
                          operator[](&local_970,2);
              local_380 = local_a58;
              local_390 = local_a68;
              uStack_388 = local_a60;
              local_3b8 = local_a68;
              uStack_3b0 = local_a60;
              local_3a0 = pbVar13;
              local_398 = pbVar12;
              ::fmt::v11::detail::value<fmt::v11::context>::
              value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                        ((value<fmt::v11::context> *)in_stack_fffffffffffff030,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffff02c,in_stack_fffffffffffff028));
              ::fmt::v11::detail::value<fmt::v11::context>::
              value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                        ((value<fmt::v11::context> *)in_stack_fffffffffffff030,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffff02c,in_stack_fffffffffffff028));
              ::fmt::v11::detail::value<fmt::v11::context>::
              value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                        ((value<fmt::v11::context> *)in_stack_fffffffffffff030,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffff02c,in_stack_fffffffffffff028));
              local_48 = &local_3c8;
              local_50 = local_3f8;
              local_3c8 = 0xddd;
              fmt_01.data_._4_1_ = in_stack_fffffffffffff294;
              fmt_01.data_._0_4_ = in_stack_fffffffffffff290;
              fmt_01.data_._5_1_ = in_stack_fffffffffffff295;
              fmt_01.data_._6_1_ = in_stack_fffffffffffff296;
              fmt_01.data_._7_1_ = in_stack_fffffffffffff297;
              fmt_01.size_ = (size_t)in_stack_fffffffffffff298;
              args_01.field_1._0_6_ = in_stack_fffffffffffff288;
              args_01.desc_ = (unsigned_long_long)pTVar11;
              args_01.field_1._6_1_ = uVar5;
              args_01.field_1._7_1_ = in_stack_fffffffffffff28f;
              local_3c0 = local_50;
              ::fmt::v11::vformat_abi_cxx11_(fmt_01,args_01);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(in_stack_fffffffffffff070,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffff068);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
            }
            else {
              sVar18 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::size
                                 (&local_970);
              local_a70 = sVar18 - 3;
              local_aa0 = "values \'{}\', \'{}\', \'{}\' (and {} other{})";
              local_a98 = 0x28;
              pbVar12 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::
                        operator[](&local_970,0);
              pbVar13 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::
                        operator[](&local_970,1);
              local_2f0 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::
                          operator[](&local_970,2);
              local_aa8 = "s";
              if (local_a70 == 1) {
                local_aa8 = "";
              }
              local_2c8 = local_a90;
              local_2d8 = local_aa0;
              uStack_2d0 = local_a98;
              local_2f8 = &local_a70;
              local_300 = &local_aa8;
              local_318 = local_aa0;
              uStack_310 = local_a98;
              local_2e8 = pbVar13;
              local_2e0 = pbVar12;
              ::fmt::v11::detail::value<fmt::v11::context>::
              value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                        ((value<fmt::v11::context> *)in_stack_fffffffffffff030,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffff02c,in_stack_fffffffffffff028));
              ::fmt::v11::detail::value<fmt::v11::context>::
              value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                        ((value<fmt::v11::context> *)in_stack_fffffffffffff030,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffff02c,in_stack_fffffffffffff028));
              ::fmt::v11::detail::value<fmt::v11::context>::
              value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                        ((value<fmt::v11::context> *)in_stack_fffffffffffff030,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffff02c,in_stack_fffffffffffff028));
              local_38 = local_348;
              local_40 = *local_2f8;
              local_28 = local_338;
              local_30 = *local_300;
              local_18 = &local_328;
              local_20 = local_378;
              local_328 = 0xc4ddd;
              fmt_02.data_._4_1_ = in_stack_fffffffffffff294;
              fmt_02.data_._0_4_ = in_stack_fffffffffffff290;
              fmt_02.data_._5_1_ = in_stack_fffffffffffff295;
              fmt_02.data_._6_1_ = in_stack_fffffffffffff296;
              fmt_02.data_._7_1_ = in_stack_fffffffffffff297;
              fmt_02.size_ = (size_t)in_stack_fffffffffffff298;
              args_02.field_1._0_6_ = in_stack_fffffffffffff288;
              args_02.desc_ = (unsigned_long_long)pTVar11;
              args_02.field_1._6_1_ = uVar5;
              args_02.field_1._7_1_ = in_stack_fffffffffffff28f;
              local_10 = local_40;
              local_8 = local_38;
              local_348[0] = local_40;
              local_338[0] = local_30;
              local_320 = local_20;
              ::fmt::v11::vformat_abi_cxx11_(fmt_02,args_02);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(in_stack_fffffffffffff070,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffff068);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
            }
          }
        }
        if (*(long *)(local_518 + 0x38) == 0) {
          puVar24 = &slang::diag::CaseEnum;
        }
        else {
          puVar24 = &slang::diag::CaseEnumExplicit;
        }
        local_ab0 = *puVar24;
        local_ac8 = *(undefined8 *)(*(long *)(local_518 + 0x20) + 0x20);
        uStack_ac0 = *(undefined8 *)(*(long *)(local_518 + 0x20) + 0x28);
        range_04.startLoc._4_1_ = in_stack_fffffffffffff054;
        range_04.startLoc._0_4_ = in_stack_fffffffffffff050;
        range_04.startLoc._5_1_ = in_stack_fffffffffffff055;
        range_04.startLoc._6_1_ = in_stack_fffffffffffff056;
        range_04.startLoc._7_1_ = in_stack_fffffffffffff057;
        range_04.endLoc = in_stack_fffffffffffff058;
        local_aac = local_ab0;
        Diagnostics::add((Diagnostics *)in_stack_fffffffffffff048,
                         (Symbol *)
                         CONCAT17(in_stack_fffffffffffff047,
                                  CONCAT16(in_stack_fffffffffffff046,
                                           CONCAT15(in_stack_fffffffffffff045,
                                                    in_stack_fffffffffffff040))),
                         in_stack_fffffffffffff064,range_04);
        Diagnostic::operator<<
                  ((Diagnostic *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
                   (string *)in_stack_fffffffffffff018);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
      }
      SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL>::~SmallVector
                ((SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *)0xa8e2c9
                );
    }
    if ((local_529 & 1U) != 0) {
      isFullyCovered::anon_class_40_5_99d61402::operator()
                ((anon_class_40_5_99d61402 *)
                 CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
      pCVar14 = std::optional<slang::analysis::CaseDecisionDag>::operator->
                          ((optional<slang::analysis::CaseDecisionDag> *)0xa8e307);
      if ((pCVar14->gaveUp & 1U) == 0) {
        std::optional<slang::analysis::CaseDecisionDag>::operator->
                  ((optional<slang::analysis::CaseDecisionDag> *)0xa8e3f8);
        bVar4 = std::optional::operator_cast_to_bool((optional<slang::SVInt> *)0xa8e404);
        sVar22._M_str = local_b28._M_str;
        sVar22._M_len = local_b28._M_len;
        if ((bVar4) && (local_b28 = sVar22, *(long *)(local_518 + 0x38) == 0)) {
          local_b04 = 0x10000e;
          local_b18 = *(undefined8 *)(*(long *)(local_518 + 0x20) + 0x20);
          uStack_b10 = *(undefined8 *)(*(long *)(local_518 + 0x20) + 0x28);
          range_06.startLoc._4_1_ = in_stack_fffffffffffff054;
          range_06.startLoc._0_4_ = in_stack_fffffffffffff050;
          range_06.startLoc._5_1_ = in_stack_fffffffffffff055;
          range_06.startLoc._6_1_ = in_stack_fffffffffffff056;
          range_06.startLoc._7_1_ = in_stack_fffffffffffff057;
          range_06.endLoc = in_stack_fffffffffffff058;
          local_b00 = Diagnostics::add((Diagnostics *)in_stack_fffffffffffff048,
                                       (Symbol *)
                                       CONCAT17(in_stack_fffffffffffff047,
                                                CONCAT16(in_stack_fffffffffffff046,
                                                         CONCAT15(in_stack_fffffffffffff045,
                                                                  in_stack_fffffffffffff040))),
                                       in_stack_fffffffffffff064,range_06);
          local_b28 = ast::SemanticFacts::getCaseConditionStr(Normal);
          arg_01._M_str = (char *)in_stack_fffffffffffff070;
          arg_01._M_len = (size_t)in_stack_fffffffffffff068;
          Diagnostic::operator<<
                    ((Diagnostic *)CONCAT44(in_stack_fffffffffffff064,in_stack_fffffffffffff060),
                     arg_01);
          std::optional<slang::analysis::CaseDecisionDag>::operator->
                    ((optional<slang::analysis::CaseDecisionDag> *)0xa8e512);
          std::optional<slang::SVInt>::operator*((optional<slang::SVInt> *)0xa8e51e);
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
                     (SVInt *)in_stack_fffffffffffff018);
          Diagnostic::operator<<
                    ((Diagnostic *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
                     (ConstantValue *)in_stack_fffffffffffff018);
          slang::ConstantValue::~ConstantValue((ConstantValue *)0xa8e554);
        }
        local_b58 = std::optional<slang::analysis::CaseDecisionDag>::operator->
                              ((optional<slang::analysis::CaseDecisionDag> *)0xa8e589);
        local_b68 = boost::unordered::
                    unordered_flat_set<unsigned_int,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::begin((unordered_flat_set<unsigned_int,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)0xa8e59e);
        local_b78 = boost::unordered::
                    unordered_flat_set<unsigned_int,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::end((unordered_flat_set<unsigned_int,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)0xa8e5bb);
        while( true ) {
          bVar4 = boost::unordered::detail::foa::operator!=
                            ((table_iterator<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                              *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
                             (table_iterator<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                              *)in_stack_fffffffffffff018);
          if (!bVar4) break;
          puVar15 = boost::unordered::detail::foa::
                    table_iterator<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                    ::operator*((table_iterator<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                                 *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
          local_b7c = *puVar15;
          local_b8c = 0x13000e;
          ppEVar17 = SmallVectorBase<const_slang::ast::Expression_*>::operator[]
                               (local_6b0,(ulong)local_b7c);
          local_ba8 = ((*ppEVar17)->sourceRange).startLoc;
          SStack_ba0 = ((*ppEVar17)->sourceRange).endLoc;
          range_07.startLoc._4_1_ = in_stack_fffffffffffff054;
          range_07.startLoc._0_4_ = in_stack_fffffffffffff050;
          range_07.startLoc._5_1_ = in_stack_fffffffffffff055;
          range_07.startLoc._6_1_ = in_stack_fffffffffffff056;
          range_07.startLoc._7_1_ = in_stack_fffffffffffff057;
          range_07.endLoc = in_stack_fffffffffffff058;
          local_b88 = Diagnostics::add((Diagnostics *)in_stack_fffffffffffff048,
                                       (Symbol *)
                                       CONCAT17(in_stack_fffffffffffff047,
                                                CONCAT16(in_stack_fffffffffffff046,
                                                         CONCAT15(in_stack_fffffffffffff045,
                                                                  in_stack_fffffffffffff040))),
                                       in_stack_fffffffffffff064,range_07);
          sVar22 = ast::SemanticFacts::getCaseConditionStr(Normal);
          arg_02._M_str = (char *)in_stack_fffffffffffff070;
          arg_02._M_len = (size_t)in_stack_fffffffffffff068;
          local_bb8 = sVar22;
          Diagnostic::operator<<
                    ((Diagnostic *)CONCAT44(in_stack_fffffffffffff064,in_stack_fffffffffffff060),
                     arg_02);
          boost::unordered::detail::foa::
          table_iterator<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
          ::operator++((table_iterator<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
        }
        pCVar14 = std::optional<slang::analysis::CaseDecisionDag>::operator->
                            ((optional<slang::analysis::CaseDecisionDag> *)0xa8e747);
        local_bc0 = &pCVar14->overlappingClauses;
        local_bd0 = boost::unordered::
                    unordered_flat_set<std::pair<unsigned_int,_unsigned_int>,_slang::hash<std::pair<unsigned_int,_unsigned_int>,_void>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ::begin((unordered_flat_set<std::pair<unsigned_int,_unsigned_int>,_slang::hash<std::pair<unsigned_int,_unsigned_int>,_void>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                             *)0xa8e760);
        local_be0 = boost::unordered::
                    unordered_flat_set<std::pair<unsigned_int,_unsigned_int>,_slang::hash<std::pair<unsigned_int,_unsigned_int>,_void>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ::end((unordered_flat_set<std::pair<unsigned_int,_unsigned_int>,_slang::hash<std::pair<unsigned_int,_unsigned_int>,_void>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                           *)0xa8e77d);
        while( true ) {
          bVar4 = boost::unordered::detail::foa::operator!=
                            ((table_iterator<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                              *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
                             (table_iterator<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                              *)in_stack_fffffffffffff018);
          if (!bVar4) break;
          ppVar16 = boost::unordered::detail::foa::
                    table_iterator<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                    ::operator*((table_iterator<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                                 *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
          local_be8 = *ppVar16;
          local_bf0 = std::get<0ul,unsigned_int,unsigned_int>
                                ((pair<unsigned_int,_unsigned_int> *)0xa8e7e8);
          local_bf8 = std::get<1ul,unsigned_int,unsigned_int>
                                ((pair<unsigned_int,_unsigned_int> *)0xa8e7fd);
          local_c04 = 0x12000e;
          ppEVar17 = SmallVectorBase<const_slang::ast::Expression_*>::operator[]
                               (local_6b0,(ulong)*local_bf8);
          local_c18 = ((*ppEVar17)->sourceRange).startLoc;
          SStack_c10 = ((*ppEVar17)->sourceRange).endLoc;
          range_08.startLoc._4_1_ = in_stack_fffffffffffff054;
          range_08.startLoc._0_4_ = in_stack_fffffffffffff050;
          range_08.startLoc._5_1_ = in_stack_fffffffffffff055;
          range_08.startLoc._6_1_ = in_stack_fffffffffffff056;
          range_08.startLoc._7_1_ = in_stack_fffffffffffff057;
          range_08.endLoc = in_stack_fffffffffffff058;
          Diagnostics::add((Diagnostics *)in_stack_fffffffffffff048,
                           (Symbol *)
                           CONCAT17(in_stack_fffffffffffff047,
                                    CONCAT16(in_stack_fffffffffffff046,
                                             CONCAT15(in_stack_fffffffffffff045,
                                                      in_stack_fffffffffffff040))),
                           in_stack_fffffffffffff064,range_08);
          sVar22 = ast::SemanticFacts::getCaseConditionStr(Normal);
          arg_03._M_str = (char *)in_stack_fffffffffffff070;
          arg_03._M_len = (size_t)in_stack_fffffffffffff068;
          local_c28 = sVar22;
          in_stack_fffffffffffff068 =
               Diagnostic::operator<<
                         ((Diagnostic *)
                          CONCAT44(in_stack_fffffffffffff064,in_stack_fffffffffffff060),arg_03);
          local_c2c = 0xc0001;
          in_stack_fffffffffffff078 = in_stack_fffffffffffff068;
          local_c00 = in_stack_fffffffffffff068;
          in_stack_fffffffffffff070 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               SmallVectorBase<const_slang::ast::Expression_*>::operator[]
                         (local_6b0,(ulong)*local_bf0);
          pEVar1 = (Expression *)(in_stack_fffffffffffff070->_M_dataplus)._M_p;
          local_c48 = (pEVar1->sourceRange).startLoc;
          uStack_c40 = *(undefined8 *)&(pEVar1->sourceRange).endLoc.field_0x0;
          noteCode_00.subsystem._1_1_ = in_stack_fffffffffffff055;
          noteCode_00.subsystem._0_1_ = in_stack_fffffffffffff054;
          noteCode_00.code._0_1_ = in_stack_fffffffffffff056;
          noteCode_00.code._1_1_ = in_stack_fffffffffffff057;
          range_00.startLoc._5_1_ = in_stack_fffffffffffff045;
          range_00.startLoc._0_5_ = in_stack_fffffffffffff040;
          range_00.startLoc._6_1_ = in_stack_fffffffffffff046;
          range_00.startLoc._7_1_ = in_stack_fffffffffffff047;
          range_00.endLoc = in_stack_fffffffffffff048;
          Diagnostic::addNote(in_stack_fffffffffffff038,noteCode_00,range_00);
          boost::unordered::detail::foa::
          table_iterator<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
          ::operator++((table_iterator<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
        }
      }
      else {
        local_ad4 = 0xc000e;
        local_ae8 = *(undefined8 *)(*(long *)(local_518 + 0x20) + 0x20);
        uStack_ae0 = *(undefined8 *)(*(long *)(local_518 + 0x20) + 0x28);
        range_05.startLoc._4_1_ = in_stack_fffffffffffff054;
        range_05.startLoc._0_4_ = in_stack_fffffffffffff050;
        range_05.startLoc._5_1_ = in_stack_fffffffffffff055;
        range_05.startLoc._6_1_ = in_stack_fffffffffffff056;
        range_05.startLoc._7_1_ = in_stack_fffffffffffff057;
        range_05.endLoc = in_stack_fffffffffffff058;
        local_ad0 = Diagnostics::add((Diagnostics *)in_stack_fffffffffffff048,
                                     (Symbol *)
                                     CONCAT17(in_stack_fffffffffffff047,
                                              CONCAT16(in_stack_fffffffffffff046,
                                                       CONCAT15(in_stack_fffffffffffff045,
                                                                in_stack_fffffffffffff040))),
                                     in_stack_fffffffffffff064,range_05);
        local_af8 = ast::SemanticFacts::getCaseConditionStr(Normal);
        arg_00._M_str = (char *)in_stack_fffffffffffff070;
        arg_00._M_len = (size_t)in_stack_fffffffffffff068;
        Diagnostic::operator<<
                  ((Diagnostic *)CONCAT44(in_stack_fffffffffffff064,in_stack_fffffffffffff060),
                   arg_00);
      }
    }
  }
  bitmask<slang::analysis::AnalysisFlags>::bitmask(&local_c4c,FullCaseUniquePriority);
  bVar6 = bitmask<slang::analysis::AnalysisFlags>::has
                    ((bitmask<slang::analysis::AnalysisFlags> *)
                     CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
                     (bitmask<slang::analysis::AnalysisFlags> *)in_stack_fffffffffffff018);
  bVar4 = false;
  if ((bVar6) && (bVar4 = true, *(int *)(local_518 + 0x44) != 1)) {
    bVar4 = *(int *)(local_518 + 0x44) == 3;
  }
  if (bVar4) {
    local_501 = true;
  }
  else {
    local_c79 = 0;
    bVar4 = ast::Type::isIntegral
                      ((Type *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
    bVar6 = true;
    if ((bVar4) && (bVar6 = true, (local_52a & 1) == 0)) {
      ast::Expression::eval
                ((Expression *)CONCAT44(in_stack_fffffffffffff02c,in_stack_fffffffffffff028),
                 (EvalContext *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
      local_c79 = 1;
      bVar6 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa8ea95);
    }
    uVar23 = (uint)bVar6 << 0x18;
    if ((local_c79 & 1) != 0) {
      slang::ConstantValue::~ConstantValue((ConstantValue *)0xa8eac6);
    }
    if ((uVar23 & 0x1000000) == 0) {
      if (*(int *)(local_518 + 0x40) == 3) {
        local_501 = false;
      }
      else {
        bitmask<slang::analysis::AnalysisFlags>::bitmask(&local_c80,FullCaseFourState);
        local_c7a = bitmask<slang::analysis::AnalysisFlags>::has
                              ((bitmask<slang::analysis::AnalysisFlags> *)
                               CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
                               (bitmask<slang::analysis::AnalysisFlags> *)in_stack_fffffffffffff018)
        ;
        if (*(int *)(local_518 + 0x40) != 0) {
          bVar4 = ast::Type::isFourState((Type *)in_stack_fffffffffffff078);
          if (bVar4) {
            if ((local_c7a & 1) == 0) {
              bVar4 = std::optional::operator_cast_to_bool
                                ((optional<slang::analysis::CaseDecisionDag> *)0xa8eda7);
              if (!bVar4) {
                isFullyCovered::anon_class_40_5_99d61402::operator()
                          ((anon_class_40_5_99d61402 *)
                           CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020));
              }
              std::optional<slang::analysis::CaseDecisionDag>::operator->
                        ((optional<slang::analysis::CaseDecisionDag> *)0xa8edc9);
              local_501 = CaseDecisionDag::isExhaustive((CaseDecisionDag *)0xa8edd1);
            }
            else {
              local_c90 = SmallVectorBase<slang::SVInt>::begin(local_670);
              pSVar19 = SmallVectorBase<slang::SVInt>::end(local_670);
              for (; local_c90 != pSVar19; local_c90 = local_c90 + 1) {
                bVar7 = SVInt::countLeadingZs((SVInt *)in_stack_fffffffffffff038);
                if (local_524 <= bVar7) {
                  local_501 = true;
                  goto LAB_00a8edef;
                }
              }
              local_501 = false;
            }
            goto LAB_00a8edef;
          }
        }
        bVar4 = ast::Type::isFourState((Type *)in_stack_fffffffffffff078);
        if ((bVar4) && ((local_c7a & 1) != 0)) {
          local_501 = false;
          if (local_524 < 0x10) {
            sVar18 = boost::unordered::
                     unordered_flat_map<slang::ConstantValue,_const_slang::ast::Expression_*,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                     ::size((unordered_flat_map<slang::ConstantValue,_const_slang::ast::Expression_*,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                             *)0xa8ebf8);
            _Var2 = std::pow<int,unsigned_int>(0,0xa8ec0e);
            local_501 = (ulong)((long)_Var2 |
                               (long)(_Var2 - 9.223372036854776e+18) & (long)_Var2 >> 0x3f) <=
                        sVar18;
          }
        }
        else {
          local_501 = false;
          if (local_524 < 0x20) {
            sVar18 = boost::unordered::
                     unordered_flat_map<slang::ConstantValue,_const_slang::ast::Expression_*,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                     ::size((unordered_flat_map<slang::ConstantValue,_const_slang::ast::Expression_*,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                             *)0xa8ec92);
            local_501 = (ulong)(1L << ((byte)local_524 & 0x3f)) <= sVar18;
          }
        }
      }
    }
    else {
      local_501 = false;
    }
  }
LAB_00a8edef:
  local_c50 = 1;
  std::optional<slang::analysis::CaseDecisionDag>::~optional
            ((optional<slang::analysis::CaseDecisionDag> *)0xa8edfc);
  SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0xa8ee09);
  SmallVector<slang::SVInt,_2UL>::~SmallVector((SmallVector<slang::SVInt,_2UL> *)0xa8ee16);
  SmallMap<slang::ConstantValue,_const_slang::ast::Expression_*,_4UL,_std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
  ::~SmallMap((SmallMap<slang::ConstantValue,_const_slang::ast::Expression_*,_4UL,_std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
               *)0xa8ee23);
  return (bool)(local_501 & 1);
}

Assistant:

bool FlowAnalysisBase::isFullyCovered(const CaseStatement& stmt) const {
    // This method determines whether a case statement's items fully cover
    // the input space, so that we know whether the default statement
    // (if there is one) is reachable or not.
    //
    // Also while we're here we will issue some diagnostics for lint issues like
    // overlapping case items and duplicate case items, if this analysis has been
    // configured to report diagnostics.

    const auto& caseType = *stmt.expr.type;
    const auto bitWidth = stmt.expr.unwrapImplicitConversions().type->getBitWidth();
    const auto cond = stmt.condition;
    const bool wildcard = cond == CaseStatementCondition::WildcardXOrZ ||
                          cond == CaseStatementCondition::WildcardJustZ;

    // Collect all constant case values, checking for duplicates and overlaps
    // if we are looking for diagnostics.
    bool hasNonConstItems = false;
    SmallMap<ConstantValue, const Expression*, 4> elems;
    SmallVector<SVInt> intVals;
    SmallVector<const Expression*> itemExpressions;
    for (auto& g : stmt.items) {
        for (auto item : g.expressions) {
            if (auto cv = item->eval(evalContext)) {
                auto [it, inserted] = elems.emplace(std::move(cv), item);
                if (!inserted) {
                    if (diagnostics) {
                        auto& diag = diagnostics->add(rootSymbol, diag::CaseDup, item->sourceRange);
                        diag << SemanticFacts::getCaseConditionStr(cond) << it->first;
                        diag.addNote(diag::NotePreviousUsage, it->second->sourceRange);
                    }
                }
                else if (it->first.isInteger()) {
                    // Save off the values for later use in building the decision
                    // DAG. One weid thing here: if the value has x bits and we're
                    // not in a casex statement we should ignore the item, since we
                    // won't check for coverage of x bits in the decision DAG and these
                    // clauses will show up as unreachable otherwise.
                    auto& val = it->first.integer();
                    if (cond != CaseStatementCondition::WildcardJustZ || val.countXs() == 0) {
                        intVals.push_back(val.trunc(bitWidth));
                        itemExpressions.push_back(item);
                    }
                }
            }
            else {
                hasNonConstItems = true;
            }

            if (diagnostics && (cond == CaseStatementCondition::Normal ||
                                cond == CaseStatementCondition::WildcardJustZ)) {
                // If we're not in a wildcard case we should warn
                // about integer literal items that have unknown bits.
                // Similarly, if we're in a wildcard case with just Zs
                // we should warn if we see Xs.
                auto& unwrapped = item->unwrapImplicitConversions();
                if (unwrapped.kind == ExpressionKind::IntegerLiteral) {
                    auto& lit = unwrapped.as<IntegerLiteral>();
                    if (cond == CaseStatementCondition::Normal && lit.getValue().hasUnknown()) {
                        diagnostics->add(rootSymbol, diag::CaseNotWildcard, item->sourceRange);
                    }
                    else if (cond == CaseStatementCondition::WildcardJustZ &&
                             lit.getValue().countXs() > 0) {
                        diagnostics->add(rootSymbol, diag::CaseZWithX, item->sourceRange);
                    }
                }
            }
        }
    }

    std::optional<CaseDecisionDag> decisionDag;
    auto makeDecisionDag = [&]() {
        decisionDag.emplace(intVals, bitWidth, cond == CaseStatementCondition::WildcardXOrZ,
                            options.maxCaseAnalysisSteps);
    };

    // If diagnostics are enabled do various lint checks now.
    if (diagnostics) {
        // Check for missing enum coverage.
        if (caseType.isEnum()) {
            SmallVector<std::string_view> missing;
            for (auto& ev : caseType.getCanonicalType().as<EnumType>().values()) {
                auto& val = ev.getValue();
                if (!elems.contains(val))
                    missing.push_back(ev.name);
            }

            if (!missing.empty()) {
                std::string msg;
                if (missing.size() == 1) {
                    msg = fmt::format("value '{}'", missing[0]);
                }
                else if (missing.size() == 2) {
                    msg = fmt::format("values '{}' and '{}'", missing[0], missing[1]);
                }
                else if (missing.size() == 3) {
                    msg = fmt::format("values '{}', '{}', and '{}'", missing[0], missing[1],
                                      missing[2]);
                }
                else {
                    const size_t remainder = missing.size() - 3;
                    msg = fmt::format("values '{}', '{}', '{}' (and {} other{})", missing[0],
                                      missing[1], missing[2], remainder, remainder == 1 ? "" : "s");
                }

                auto code = stmt.defaultCase ? diag::CaseEnumExplicit : diag::CaseEnum;
                diagnostics->add(rootSymbol, code, stmt.expr.sourceRange) << msg;
            }
        }

        // If this is a wildcard case statement check for overlaps.
        if (wildcard) {
            makeDecisionDag();

            if (decisionDag->gaveUp) {
                auto& diag = diagnostics->add(rootSymbol, diag::CaseComplex, stmt.expr.sourceRange);
                diag << SemanticFacts::getCaseConditionStr(cond);
            }
            else {
                if (decisionDag->counterexample && !stmt.defaultCase) {
                    auto& diag = diagnostics->add(rootSymbol, diag::CaseIncomplete,
                                                  stmt.expr.sourceRange);
                    diag << SemanticFacts::getCaseConditionStr(cond);
                    diag << *decisionDag->counterexample;
                }

                for (auto index : decisionDag->unreachableClauses) {
                    auto& diag = diagnostics->add(rootSymbol, diag::CaseUnreachable,
                                                  itemExpressions[index]->sourceRange);
                    diag << SemanticFacts::getCaseConditionStr(cond);
                }

                for (auto [first, second] : decisionDag->overlappingClauses) {
                    auto& diag = diagnostics->add(rootSymbol, diag::CaseOverlap,
                                                  itemExpressions[second]->sourceRange)
                                 << SemanticFacts::getCaseConditionStr(cond);
                    diag.addNote(diag::NotePreviousUsage, itemExpressions[first]->sourceRange);
                }
            }
        }
    }

    // If the case statement asserts it has full coverage, and our flags allow it,
    // assume full coverage without checking.
    if (options.flags.has(AnalysisFlags::FullCaseUniquePriority) &&
        (stmt.check == UniquePriorityCheck::Unique ||
         stmt.check == UniquePriorityCheck::Priority)) {
        return true;
    }

    // If the case type is not integral then we can never fully satisfy the condition.
    // Non-constant items or constant condition is also not coverable.
    if (!caseType.isIntegral() || hasNonConstItems || stmt.expr.eval(evalContext))
        return false;

    // TODO: handle case inside
    if (stmt.condition == CaseStatementCondition::Inside)
        return false;

    const bool fullCaseFourState = options.flags.has(AnalysisFlags::FullCaseFourState);
    if (stmt.condition == CaseStatementCondition::Normal || !caseType.isFourState()) {
        // The number of non-duplicate elements needs to match the number
        // of possible values for the case expression. This depends on
        // whether the type is 2-state or 4-state.
        if (caseType.isFourState() && fullCaseFourState)
            return bitWidth < 16 && elems.size() >= (size_t)std::pow(4, bitWidth);
        else
            return bitWidth < 32 && elems.size() >= (1ull << bitWidth);
    }

    // If we're checking for four-state wildcard coverage we simply need to
    // find an entry that is all Z bits. This is because Z is always a wildcard,
    // so the only way to specify an entry that hits all Z's will also cover
    // all other bits too.
    if (fullCaseFourState) {
        for (auto& val : intVals) {
            if (val.countLeadingZs() >= bitWidth)
                return true;
        }
        return false;
    }

    // Otherwise do the full wildcard coverage search.
    if (!decisionDag)
        makeDecisionDag();

    return decisionDag->isExhaustive();
}